

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu2.c
# Opt level: O2

MPP_RET hal_avsd_vdpu2_wait(void *decoder,HalTaskInfo *task)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  MPP_RET MVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  HalTaskInfo *local_40;
  long local_38;
  uint local_30;
  
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","In.","hal_avsd_vdpu2_wait");
  }
  if ((((ulong)(task->dec).flags & 0xc) == 0) ||
     (*(int *)(*(long *)((long)decoder + 0x88) + 0x30) != 0)) {
    MVar4 = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),0x10,(void *)0x0);
    if (MVar4 != MPP_OK) {
      _mpp_log_l(2,"hal_avsd_vdpu2","poll cmd failed %d\n","hal_avsd_vdpu2_wait",(ulong)(uint)MVar4)
      ;
    }
  }
  if (*(MppCbCtx **)((long)decoder + 0x78) != (MppCbCtx *)0x0) {
    local_38 = *(long *)((long)decoder + 0x1a0);
    local_30 = (uint)((*(byte *)(local_38 + 0xdc) & 0x10) == 0);
    local_40 = task;
    mpp_callback_f("hal_avsd_vdpu2_wait",*(MppCbCtx **)((long)decoder + 0x78),&local_40);
    if (((byte)avsd_hal_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_avsd_vdpu2","reg[55]=%08x, ref=%d, dpberr=%d, harderr=%d\n",(char *)0x0,
                 (ulong)*(uint *)(*(long *)((long)decoder + 0x1a0) + 0xdc),
                 (ulong)(*(uint *)&(task->dec).flags >> 4 & 1),
                 (ulong)(*(uint *)&(task->dec).flags >> 3 & 1),(ulong)local_30);
    }
  }
  iVar6 = *(int *)((long)decoder + 0xf4);
  if ((iVar6 == 1) || (*(int *)((long)decoder + 0x1fc) == 0)) {
    *(undefined4 *)((long)decoder + 0x1fc) = 1;
    iVar1 = *(int *)((long)decoder + 0xdc);
    if (iVar1 != 2) {
      uVar2 = *(undefined4 *)((long)decoder + 0x210);
      *(undefined4 *)((long)decoder + 0x210) = *(undefined4 *)((long)decoder + 0x20c);
      iVar3 = *(int *)((long)decoder + 0x214);
      *(int *)((long)decoder + 0x20c) = iVar3;
      if (-1 < (long)iVar3) {
        *(uint *)((long)decoder + (long)iVar3 * 0x14 + 0x1c4) = (uint)(iVar1 == 0);
      }
      *(undefined4 *)((long)decoder + 0x214) = uVar2;
      *(int *)((long)decoder + 0x200) = iVar6;
    }
    *(int *)((long)decoder + 0x204) = iVar1;
  }
  else {
    *(undefined4 *)((long)decoder + 0x1fc) = 0;
  }
  *(undefined4 *)(*(long *)((long)decoder + 0x1a0) + 0xdc) = 0;
  if (((*(int *)((long)decoder + 0x1fc) == 0) && (*(int *)((long)decoder + 0xf4) == 0)) &&
     ((((ulong)(task->dec).flags & 0xc) == 0 ||
      (*(int *)(*(long *)((long)decoder + 0x88) + 0x30) != 0)))) {
    local_40 = (HalTaskInfo *)0x0;
    uVar5 = (*(uint *)(*(long *)((long)decoder + 0x1a0) + 0x100) >> 10) +
            *(int *)((long)decoder + 0x198);
    lVar10 = 0;
    iVar6 = uVar5 - 8;
    if (uVar5 < 8) {
      iVar6 = 0;
    }
    *(int *)((long)decoder + 0x218) = iVar6;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)decoder + 0x60),(task->dec).input,SLOT_BUFFER,&local_40);
    pvVar7 = mpp_buffer_get_ptr_with_caller(local_40,"repeat_other_field");
    uVar9 = (ulong)*(uint *)((long)decoder + 0x218);
    lVar8 = (long)pvVar7 + 2;
    for (; lVar10 != -0x10; lVar10 = lVar10 + -1) {
      if (((*(char *)(lVar8 + -2 + uVar9) == '\0') && (*(char *)(lVar8 + -1 + uVar9) == '\0')) &&
         (*(char *)(lVar8 + uVar9) == '\x01')) {
        uVar5 = *(uint *)((long)decoder + 0x218) - (int)lVar10;
        uVar9 = (ulong)uVar5;
        iVar6 = -(int)lVar10;
        *(uint *)((long)decoder + 0x218) = uVar5;
        goto LAB_001d8dd2;
      }
      lVar8 = lVar8 + 1;
    }
    iVar6 = 0x10;
LAB_001d8dd2:
    if (((byte)avsd_hal_debug & 0x10) != 0) {
      _mpp_log_l(4,"hal_avsd_vdpu2","frame_no %d idx %d offset %x\n",(char *)0x0,
                 (ulong)*(uint *)((long)decoder + 0x21c),iVar6,uVar9);
    }
    MVar4 = set_regs_parameters((AvsdHalCtx_t *)decoder,&task->dec);
    if (MVar4 < MPP_OK) {
      if (((byte)avsd_hal_debug & 4) != 0) {
        _mpp_log_l(4,"hal_avsd_vdpu2","Function error(%d).\n",(char *)0x0,0x1c9);
      }
    }
    else {
      hal_avsd_vdpu2_start(decoder,task);
      hal_avsd_vdpu2_wait(decoder,task);
    }
  }
  *(int *)((long)decoder + 0x21c) = *(int *)((long)decoder + 0x21c) + 1;
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","Out.","hal_avsd_vdpu2_wait");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_vdpu2_wait(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->dec_cfg->base.disable_error) {
        goto __SKIP_HARD;
    }

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

__SKIP_HARD:
    if (p_hal->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)p_hal->p_regs;

        if (!((AvsdVdpu2Regs_t *)p_hal->p_regs)->sw55.dec_rdy_sts) {
            param.hard_err = 1;
        } else
            param.hard_err = 0;

        mpp_callback(p_hal->dec_cb, &param);
        AVSD_HAL_DBG(AVSD_HAL_DBG_WAIT, "reg[55]=%08x, ref=%d, dpberr=%d, harderr=%d\n",
                     p_hal->p_regs[55], task->dec.flags.used_for_ref, task->dec.flags.ref_err, param.hard_err);
    }

    update_parameters(p_hal);
    memset(&p_hal->p_regs[55], 0, sizeof(RK_U32));
    if (!p_hal->first_field && p_hal->syn.pp.pictureStructure == FIELDPICTURE &&
        ((!task->dec.flags.parse_err && !task->dec.flags.ref_err) ||
         p_hal->dec_cfg->base.disable_error)) {
        repeat_other_field(p_hal, task);
    }
    p_hal->frame_no++;

    AVSD_HAL_TRACE("Out.");
    return ret = MPP_OK;
}